

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

int __thiscall despot::QNode::Size(QNode *this)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  int size;
  QNode *this_local;
  
  it._M_node._4_4_ = 0;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
       ::begin(&this->children_);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
         ::end(&this->children_);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::
             operator->(&local_20);
    iVar2 = VNode::Size(ppVar3->second);
    it._M_node._4_4_ = iVar2 + it._M_node._4_4_;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator++
              (&local_20,0);
  }
  return it._M_node._4_4_;
}

Assistant:

int QNode::Size() const {
	int size = 0;
	for (map<OBS_TYPE, VNode*>::const_iterator it = children_.begin();
		it != children_.end(); it++) {
		size += it->second->Size();
	}
	return size;
}